

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPrecompileHeadersCommand.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1041145::TargetPrecompileHeadersImpl::HandleMissingTarget
          (TargetPrecompileHeadersImpl *this,string *name)

{
  cmMakefile *this_00;
  string local_90;
  cmAlphaNum local_70;
  cmAlphaNum local_40;
  
  this_00 = (this->super_cmTargetPropCommandBase).Makefile;
  local_40.View_._M_len = 0x2e;
  local_40.View_._M_str = "Cannot specify precompile headers for target \"";
  local_70.View_._M_str = (name->_M_dataplus)._M_p;
  local_70.View_._M_len = name->_M_string_length;
  cmStrCat<char[38]>(&local_90,&local_40,&local_70,
                     (char (*) [38])"\" which is not built by this project.");
  cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void HandleMissingTarget(const std::string& name) override
  {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Cannot specify precompile headers for target \"", name,
               "\" which is not built by this project."));
  }